

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_> * __thiscall
pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
def<anurbs::Ref<anurbs::BrepTrim>(anurbs::BrepEdge::*)(unsigned_long)const,pybind11::arg>
          (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *this,char *name_,
          offset_in_Model_to_subr *f,arg *extra)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  cpp_function cf;
  handle local_70;
  undefined1 local_68 [8];
  handle local_60;
  object local_58;
  object local_50;
  is_method local_48;
  handle local_40;
  handle local_38;
  object local_30;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_58.super_handle.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48.class_.m_ptr = (handle)(handle)name_;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68 = (undefined1  [8])local_70.m_ptr;
  cpp_function::
  cpp_function<anurbs::Ref<anurbs::BrepTrim>,anurbs::BrepEdge,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            ((cpp_function *)&local_60,f_00,extra_00,&local_48,(sibling *)&local_58,(arg *)local_68)
  ;
  object::~object((object *)&local_70);
  object::~object(&local_50);
  cpp_function::name((cpp_function *)local_68);
  local_40.m_ptr = *(PyObject **)this;
  if ((object)local_68 != (PyObject *)0x0) {
    *(long *)local_68 = *(long *)local_68 + 1;
  }
  local_38.m_ptr = (PyObject *)local_68;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(&local_58);
  detail::accessor_policies::obj_attr::set(local_40,local_38,local_60);
  object::~object(&local_30);
  object::~object((object *)&local_38);
  object::~object((object *)local_68);
  object::~object((object *)&local_60);
  return (class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }